

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Pass * wasm::createI64ToI32LoweringPass(void)

{
  I64ToI32Lowering *this;
  
  this = (I64ToI32Lowering *)operator_new(600);
  memset(this,0,600);
  I64ToI32Lowering::I64ToI32Lowering(this);
  return (Pass *)this;
}

Assistant:

Pass* createI64ToI32LoweringPass() { return new I64ToI32Lowering(); }